

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::copyTexImage1D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int border)

{
  Texture1D *pTVar1;
  uint uVar2;
  undefined4 extraout_EAX;
  uint uVar3;
  pointer pTVar4;
  Texture1D *this_00;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  TextureFormat local_98;
  MultisampleConstPixelBufferAccess src;
  PixelBufferAccess dst;
  
  pTVar4 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&dst,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&src,(MultisamplePixelBufferAccess *)&dst);
  if (border != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (-1 < (width | level)) {
    if (((src.m_access.m_size.m_data[0] == 0) || (src.m_access.m_size.m_data[1] == 0)) ||
       (src.m_access.m_size.m_data[2] == 0)) goto LAB_006f074e;
    local_98 = mapInternalFormat(internalFormat);
    if ((local_98.order == CHANNELORDER_LAST || local_98.type == CHANNELTYPE_LAST) ||
       (target != 0xde0)) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    uVar3 = (this->m_limits).maxTexture2DSize;
    if (width <= (int)uVar3) {
      if (uVar3 == 0) {
        uVar2 = 0x20;
      }
      else {
        uVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar2 = uVar2 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar2)) {
        pTVar1 = pTVar4->tex1DBinding;
        this_00 = &pTVar4->default1DTex;
        if (pTVar1 != (Texture1D *)0x0) {
          this_00 = pTVar1;
        }
        if ((this_00->super_Texture).m_immutable == true) {
          if (((uint)level < 0xe) && ((this_00->m_levels).m_data[(uint)level].m_cap != 0)) {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      (&dst.super_ConstPixelBufferAccess,
                       &(this_00->m_levels).m_access[(uint)level].super_ConstPixelBufferAccess);
            iVar6 = -(uint)(dst.super_ConstPixelBufferAccess.m_format.order == local_98.order);
            iVar7 = -(uint)(dst.super_ConstPixelBufferAccess.m_format.type == local_98.type);
            auVar5._4_4_ = iVar6;
            auVar5._0_4_ = iVar6;
            auVar5._8_4_ = iVar7;
            auVar5._12_4_ = iVar7;
            uVar3 = movmskpd(extraout_EAX,auVar5);
            if (((uVar3 & 1) != 0) &&
               (((byte)((byte)uVar3 >> 1) != 0 &&
                (dst.super_ConstPixelBufferAccess.m_size.m_data[0] == width)))) goto LAB_006f0784;
          }
LAB_006f074e:
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x502;
          return;
        }
        rc::Texture1D::allocLevel(this_00,level,&local_98,width);
LAB_006f0784:
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&dst.super_ConstPixelBufferAccess,
                   &(this_00->m_levels).m_access[level].super_ConstPixelBufferAccess);
        iVar6 = 0;
        if (width < 1) {
          width = iVar6;
        }
        for (; width != iVar6; iVar6 = iVar6 + 1) {
          iVar7 = x + iVar6;
          if ((-1 < iVar7) && (iVar7 < src.m_access.m_size.m_data[1])) {
            rr::resolveMultisamplePixel
                      ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&src,iVar7
                      );
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&dst.super_ConstPixelBufferAccess,
                       (Vec4 *)&stack0xffffffffffffffc0,iVar6,0,0);
          }
        }
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage1D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}